

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O0

unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
__thiscall
yactfr::internal::PktProcBuilder::_buildDsPktProc(PktProcBuilder *this,DataStreamType *dst)

{
  bool bVar1;
  StructureType *pSVar2;
  pointer pDVar3;
  Proc *pPVar4;
  EventRecordTypeSet *this_00;
  DataStreamType *in_RDX;
  unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> local_68;
  unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> erProc;
  unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
  *ert;
  iterator __end2;
  iterator __begin2;
  EventRecordTypeSet *__range2;
  DataStreamType *dst_local;
  PktProcBuilder *this_local;
  __single_object *dsPktProc;
  
  std::make_unique<yactfr::internal::DsPktProc,yactfr::DataStreamType_const&>
            ((DataStreamType *)this);
  pSVar2 = DataStreamType::packetContextType(in_RDX);
  pDVar3 = std::
           unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
           ::operator->((unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
                         *)this);
  pPVar4 = DsPktProc::pktPreambleProc(pDVar3);
  _buildReadScopeInstr((PktProcBuilder *)dst,PacketContext,(DataType *)pSVar2,pPVar4);
  pSVar2 = DataStreamType::eventRecordHeaderType(in_RDX);
  pDVar3 = std::
           unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
           ::operator->((unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
                         *)this);
  pPVar4 = DsPktProc::erPreambleProc(pDVar3);
  _buildReadScopeInstr((PktProcBuilder *)dst,EventRecordHeader,(DataType *)pSVar2,pPVar4);
  pSVar2 = DataStreamType::eventRecordCommonContextType(in_RDX);
  pDVar3 = std::
           unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
           ::operator->((unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
                         *)this);
  pPVar4 = DsPktProc::erPreambleProc(pDVar3);
  _buildReadScopeInstr((PktProcBuilder *)dst,EventRecordCommonContext,(DataType *)pSVar2,pPVar4);
  this_00 = DataStreamType::eventRecordTypes(in_RDX);
  __end2 = std::
           set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
           ::begin(this_00);
  ert = (unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
         *)std::
           set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
           ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&ert);
    if (!bVar1) {
      return (__uniq_ptr_data<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>,_true,_true>
              )(__uniq_ptr_data<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>,_true,_true>
                )this;
    }
    erProc._M_t.
    super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>.
    _M_t.
    super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
    .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl =
         (__uniq_ptr_data<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>,_true,_true>
          )std::
           _Rb_tree_const_iterator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>
           ::operator*(&__end2);
    std::
    unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>::
    operator*((unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
               *)erProc._M_t.
                 super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
                 .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl);
    _buildErProc((PktProcBuilder *)&stack0xffffffffffffffa0,(EventRecordType *)dst);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffa0);
    if (!bVar1) break;
    pDVar3 = std::
             unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
             ::operator->((unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
                           *)this);
    std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>::
    unique_ptr(&local_68,
               (unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                *)&stack0xffffffffffffffa0);
    DsPktProc::addErProc(pDVar3,&local_68);
    std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>::
    ~unique_ptr(&local_68);
    std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>::
    ~unique_ptr((unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                 *)&stack0xffffffffffffffa0);
    std::
    _Rb_tree_const_iterator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("erProc",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/pkt-proc-builder.cpp"
                ,0x360,
                "std::unique_ptr<DsPktProc> yactfr::internal::PktProcBuilder::_buildDsPktProc(const DataStreamType &)"
               );
}

Assistant:

std::unique_ptr<DsPktProc> PktProcBuilder::_buildDsPktProc(const DataStreamType& dst)
{
    auto dsPktProc = std::make_unique<DsPktProc>(dst);

    this->_buildReadScopeInstr(Scope::PacketContext, dst.packetContextType(),
                               dsPktProc->pktPreambleProc());
    this->_buildReadScopeInstr(Scope::EventRecordHeader, dst.eventRecordHeaderType(),
                               dsPktProc->erPreambleProc());
    this->_buildReadScopeInstr(Scope::EventRecordCommonContext,
                               dst.eventRecordCommonContextType(), dsPktProc->erPreambleProc());

    for (auto& ert : dst.eventRecordTypes()) {
        auto erProc = this->_buildErProc(*ert);

        assert(erProc);
        dsPktProc->addErProc(std::move(erProc));
    }

    return dsPktProc;
}